

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O3

void verifyOrthonormal<double>(Matrix44<double> *A)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 *puVar19;
  long lVar20;
  long lVar21;
  double dStack_c0;
  double dStack_a0;
  undefined1 local_88 [16];
  double local_78;
  double dStack_70;
  double local_68;
  double local_60;
  double dStack_58;
  double local_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  dVar1 = A->x[1][0];
  dVar2 = A->x[3][0];
  dVar3 = A->x[1][1];
  dVar4 = A->x[3][1];
  dVar5 = A->x[1][2];
  dVar6 = A->x[3][2];
  dVar15 = A->x[0][1];
  dVar7 = A->x[1][3];
  dVar8 = A->x[3][3];
  local_50 = dVar7 * dVar8 + dVar5 * dVar6 + dVar1 * dVar2 + dVar3 * dVar4;
  dVar9 = A->x[2][1];
  auVar13._8_4_ = SUB84(dVar4,0);
  auVar13._0_8_ = dVar9;
  auVar13._12_4_ = (int)((ulong)dVar4 >> 0x20);
  dVar10 = A->x[2][0];
  auVar14._8_4_ = SUB84(dVar2,0);
  auVar14._0_8_ = dVar10;
  auVar14._12_4_ = (int)((ulong)dVar2 >> 0x20);
  dVar11 = A->x[2][2];
  dVar12 = A->x[2][3];
  dVar16 = A->x[0][0];
  dVar17 = A->x[0][2];
  dVar18 = A->x[0][3];
  local_68 = dVar7 * dVar18 + dVar5 * dVar17 + dVar1 * dVar16 + dVar3 * dVar15;
  dStack_a0 = auVar13._8_8_;
  dStack_c0 = auVar14._8_8_;
  local_78 = dVar18 * dVar12 + dVar17 * dVar11 + dVar16 * dVar10 + dVar15 * dVar9;
  dStack_70 = dVar18 * dVar8 + dVar17 * dVar6 + dVar16 * dStack_c0 + dVar15 * dStack_a0;
  puVar19 = local_88;
  local_88._8_4_ = SUB84(local_68,0);
  local_88._0_8_ = dVar18 * dVar18 + dVar17 * dVar17 + dVar16 * dVar16 + dVar15 * dVar15;
  local_88._12_4_ = (int)((ulong)local_68 >> 0x20);
  dStack_58 = dVar12 * dVar7 + dVar11 * dVar5 + dVar10 * dVar1 + dVar9 * dVar3;
  local_60 = dVar7 * dVar7 + dVar5 * dVar5 + dVar1 * dVar1 + dVar3 * dVar3;
  local_48 = local_78;
  dStack_40 = dStack_58;
  dStack_30 = dVar12 * dVar8 + dVar11 * dVar6 + dVar10 * dStack_c0 + dVar9 * dStack_a0;
  local_38 = dVar12 * dVar12 + dVar11 * dVar11 + dVar10 * dVar10 + dVar9 * dVar9;
  local_28 = dStack_70;
  local_20 = local_50;
  local_18 = dStack_30;
  local_10 = dVar8 * dVar8 + dVar6 * dVar6 + dVar2 * dVar2 + dVar4 * dVar4;
  lVar20 = 0;
  do {
    lVar21 = 0;
    do {
      if (lVar20 == lVar21) {
        if (2.220446049250313e-14 < ABS(*(double *)(local_88 + lVar20 * 0x28) + -1.0)) {
          __assert_fail("std::abs (prod[i][j] - 1) <= valueEps",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                        ,0x30,"void verifyOrthonormal(const Imath_3_2::Matrix44<T> &) [T = double]")
          ;
        }
      }
      else if (2.220446049250313e-14 < ABS(*(double *)(puVar19 + lVar21 * 8))) {
        __assert_fail("std::abs (prod[i][j]) <= valueEps",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x32,"void verifyOrthonormal(const Imath_3_2::Matrix44<T> &) [T = double]");
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != 4);
    lVar20 = lVar20 + 1;
    puVar19 = puVar19 + 0x20;
  } while (lVar20 != 4);
  return;
}

Assistant:

void
verifyOrthonormal (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    const T valueEps = T (100) * std::numeric_limits<T>::epsilon ();

    const IMATH_INTERNAL_NAMESPACE::Matrix44<T> prod = A * A.transposed ();
    for (int i = 0; i < 4; ++i)
    {
        for (int j = 0; j < 4; ++j)
        {
            if (i == j)
                assert (std::abs (prod[i][j] - 1) <= valueEps);
            else
                assert (std::abs (prod[i][j]) <= valueEps);
        }
    }
}